

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCol(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  long lVar1;
  Representation RVar2;
  SPxStatus SVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  Status *pSVar5;
  SPxId *pSVar6;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  SPxId id;
  DataKey local_40;
  SPxColId local_38;
  
  RVar2 = this->theLP->theRep;
  if (RVar2 == COLUMN) {
    if ((this->thedesc).colstat.data[i] < D_FREE) goto LAB_0025b4ac;
    SVar3 = this->thestatus;
  }
  else {
    this->factorized = false;
    SVar3 = this->thestatus;
    if (0 < RVar2 * (this->thedesc).colstat.data[i]) {
      if (NO_PROBLEM < SVar3) {
        iVar8 = (this->theLP->thecovectors->set).thenum;
        lVar10 = (long)iVar8;
        if (-1 < lVar10) {
          lVar9 = lVar10 * 8;
          lVar11 = 1;
          do {
            local_40 = *(DataKey *)((long)&(((this->theBaseId).data)->super_DataKey).info + lVar9);
            if ((0 < local_40.info) &&
               (pSVar4 = this->theLP, SPxColId::SPxColId(&local_38,(SPxId *)&local_40),
               (pSVar4->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem[local_38.super_DataKey.idx].info < 0)) {
              pSVar6 = (this->theBaseId).data;
              *(DataKey *)((long)&(pSVar6->super_DataKey).info + lVar9) =
                   pSVar6[(this->theLP->thecovectors->set).thenum].super_DataKey;
              if ((this->matrixIsSetup == true) && (iVar8 < (this->theLP->thecovectors->set).thenum)
                 ) {
                pSVar7 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::vector(this->theLP,
                                  (SPxId *)((long)&(((this->theBaseId).data)->super_DataKey).info +
                                           lVar9));
                *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)((long)(this->matrix).data + lVar9) = pSVar7;
              }
              break;
            }
            iVar8 = iVar8 + -1;
            lVar9 = lVar9 + -8;
            lVar1 = lVar10 + lVar11;
            lVar11 = lVar11 + -1;
          } while (lVar1 != 1 && -1 < lVar1 + -1);
        }
      }
      goto LAB_0025b4ac;
    }
  }
  if (SVar3 != NO_PROBLEM) {
    this->thestatus = NO_PROBLEM;
    invalidate(this);
  }
LAB_0025b4ac:
  pSVar5 = (this->thedesc).colstat.data;
  pSVar5[i] = pSVar5[(this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum];
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedCol(int i)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      if(theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = false;

      if(!theLP->isBasic(thedesc.colStatus(i)))
         setStatus(NO_PROBLEM);
      else if(status() > NO_PROBLEM)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxColId() && !theLP->has(SPxColId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(matrixIsSetup &&
                     j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.colStatus(i) = thedesc.colStatus(theLP->nCols());
   reDim();
}